

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStream_Initialize
                  (PaAlsaStream *self,PaAlsaHostApiRepresentation *alsaApi,
                  PaStreamParameters *inParams,PaStreamParameters *outParams,double sampleRate,
                  unsigned_long framesPerUserBuffer,PaStreamCallback *callback,
                  PaStreamFlags streamFlags,void *userData)

{
  PaError PVar1;
  pollfd *ppVar2;
  PaError local_44;
  int __pa_assert_error_id;
  PaError result;
  PaStreamCallback *callback_local;
  unsigned_long framesPerUserBuffer_local;
  double sampleRate_local;
  PaStreamParameters *outParams_local;
  PaStreamParameters *inParams_local;
  PaAlsaHostApiRepresentation *alsaApi_local;
  PaAlsaStream *self_local;
  
  local_44 = 0;
  if (self == (PaAlsaStream *)0x0) {
    __assert_fail("self",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x859,
                  "PaError PaAlsaStream_Initialize(PaAlsaStream *, PaAlsaHostApiRepresentation *, const PaStreamParameters *, const PaStreamParameters *, double, unsigned long, PaStreamCallback *, PaStreamFlags, void *)"
                 );
  }
  memset(self,0,0x388);
  if (callback == (PaStreamCallback *)0x0) {
    PaUtil_InitializeStreamRepresentation
              (&self->streamRepresentation,&alsaApi->blockingStreamInterface,(PaStreamCallback *)0x0
               ,userData);
  }
  else {
    PaUtil_InitializeStreamRepresentation
              (&self->streamRepresentation,&alsaApi->callbackStreamInterface,callback,userData);
    self->callbackMode = 1;
  }
  self->framesPerUserBuffer = framesPerUserBuffer;
  self->neverDropInput = (uint)streamFlags & 4;
  memset(&self->capture,0,0x80);
  memset(&self->playback,0,0x80);
  if ((inParams == (PaStreamParameters *)0x0) ||
     (paUtilErr_ = PaAlsaStreamComponent_Initialize
                             (&self->capture,alsaApi,inParams,StreamDirection_In,
                              (uint)(callback != (PaStreamCallback *)0x0)), -1 < paUtilErr_)) {
    if ((outParams == (PaStreamParameters *)0x0) ||
       (paUtilErr_ = PaAlsaStreamComponent_Initialize
                               (&self->playback,alsaApi,outParams,StreamDirection_Out,
                                (uint)(callback != (PaStreamCallback *)0x0)), -1 < paUtilErr_)) {
      if (((self->capture).nfds == 0) && ((self->playback).nfds == 0)) {
        __assert_fail("self->capture.nfds || self->playback.nfds",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x87d,
                      "PaError PaAlsaStream_Initialize(PaAlsaStream *, PaAlsaHostApiRepresentation *, const PaStreamParameters *, const PaStreamParameters *, double, unsigned long, PaStreamCallback *, PaStreamFlags, void *)"
                     );
      }
      ppVar2 = (pollfd *)
               PaUtil_AllocateMemory((ulong)((self->capture).nfds + (self->playback).nfds) << 3);
      self->pfds = ppVar2;
      if (ppVar2 == (pollfd *)0x0) {
        PaUtil_DebugPrint(
                         "Expression \'self->pfds = (struct pollfd*)PaUtil_AllocateMemory( ( self->capture.nfds + self->playback.nfds ) * sizeof( struct pollfd ) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2176\n"
                         );
        local_44 = -0x2708;
      }
      else {
        PaUtil_InitializeCpuLoadMeasurer(&self->cpuLoadMeasurer,sampleRate);
        PVar1 = PaUnixMutex_Initialize(&self->stateMtx);
        if (PVar1 != 0) {
          __assert_fail("paNoError == __pa_assert_error_id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                        ,0x883,
                        "PaError PaAlsaStream_Initialize(PaAlsaStream *, PaAlsaHostApiRepresentation *, const PaStreamParameters *, const PaStreamParameters *, double, unsigned long, PaStreamCallback *, PaStreamFlags, void *)"
                       );
        }
      }
    }
    else {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStreamComponent_Initialize( &self->playback, alsaApi, outParams, StreamDirection_Out, NULL != callback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2170\n"
                       );
      local_44 = paUtilErr_;
    }
  }
  else {
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStreamComponent_Initialize( &self->capture, alsaApi, inParams, StreamDirection_In, NULL != callback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2166\n"
                     );
    local_44 = paUtilErr_;
  }
  return local_44;
}

Assistant:

static PaError PaAlsaStream_Initialize( PaAlsaStream *self, PaAlsaHostApiRepresentation *alsaApi, const PaStreamParameters *inParams,
        const PaStreamParameters *outParams, double sampleRate, unsigned long framesPerUserBuffer, PaStreamCallback callback,
        PaStreamFlags streamFlags, void *userData )
{
    PaError result = paNoError;
    assert( self );

    memset( self, 0, sizeof( PaAlsaStream ) );

    if( NULL != callback )
    {
        PaUtil_InitializeStreamRepresentation( &self->streamRepresentation,
                                               &alsaApi->callbackStreamInterface,
                                               callback, userData );
        self->callbackMode = 1;
    }
    else
    {
        PaUtil_InitializeStreamRepresentation( &self->streamRepresentation,
                                               &alsaApi->blockingStreamInterface,
                                               NULL, userData );
    }

    self->framesPerUserBuffer = framesPerUserBuffer;
    self->neverDropInput = streamFlags & paNeverDropInput;
    /* XXX: Ignore paPrimeOutputBuffersUsingStreamCallback untill buffer priming is fully supported in pa_process.c */
    /*
    if( outParams & streamFlags & paPrimeOutputBuffersUsingStreamCallback )
        self->primeBuffers = 1;
        */
    memset( &self->capture, 0, sizeof (PaAlsaStreamComponent) );
    memset( &self->playback, 0, sizeof (PaAlsaStreamComponent) );
    if( inParams )
    {
        PA_ENSURE( PaAlsaStreamComponent_Initialize( &self->capture, alsaApi, inParams, StreamDirection_In, NULL != callback ) );
    }
    if( outParams )
    {
        PA_ENSURE( PaAlsaStreamComponent_Initialize( &self->playback, alsaApi, outParams, StreamDirection_Out, NULL != callback ) );
    }

    assert( self->capture.nfds || self->playback.nfds );

    PA_UNLESS( self->pfds = (struct pollfd*)PaUtil_AllocateMemory( ( self->capture.nfds +
                    self->playback.nfds ) * sizeof( struct pollfd ) ), paInsufficientMemory );

    PaUtil_InitializeCpuLoadMeasurer( &self->cpuLoadMeasurer, sampleRate );
    ASSERT_CALL_( PaUnixMutex_Initialize( &self->stateMtx ), paNoError );

error:
    return result;
}